

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_relax_snode.c
# Opt level: O1

void ilu_relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end,
                    int *relax_fsupc)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  ifill(relax_end,n,-1);
  ifill(relax_fsupc,n,-1);
  uVar6 = (ulong)(uint)n;
  if (0 < n) {
    memset(descendants,0,uVar6 * 4);
    uVar1 = 0;
    do {
      iVar4 = et[uVar1];
      if (iVar4 != n) {
        descendants[iVar4] = descendants[uVar1] + descendants[iVar4] + 1;
      }
      uVar1 = uVar1 + 1;
    } while (uVar6 != uVar1);
  }
  if (0 < n) {
    lVar2 = 0;
    iVar4 = 0;
    do {
      iVar3 = iVar4;
      for (iVar7 = et[iVar4]; (iVar7 != n && (descendants[iVar7] < relax_columns));
          iVar7 = et[iVar7]) {
        iVar3 = iVar7;
      }
      relax_end[iVar4] = iVar3;
      relax_fsupc[lVar2] = iVar4;
      lVar5 = (long)iVar3;
      iVar4 = iVar3;
      do {
        lVar5 = lVar5 + 1;
        iVar4 = iVar4 + 1;
        if (descendants[lVar5] == 0) break;
      } while (lVar5 < (long)uVar6);
      lVar2 = lVar2 + 1;
    } while (iVar4 < n);
  }
  return;
}

Assistant:

void
ilu_relax_snode (
	      const	int n,
	      const int	*et,	       /* column elimination tree */
	      const int relax_columns, /* max no of columns allowed in a
					  relaxed snode */
	      int	*descendants,  /* no of descendants of each node
					 in the etree */
	      int	*relax_end,    /* last column in a supernode
					* if j-th column starts a relaxed
					* supernode, relax_end[j] represents
					* the last column of this supernode */
	      int	*relax_fsupc   /* first column in a supernode
					* relax_fsupc[j] represents the first
					* column of j-th supernode */
	     )
{

    register int j, f, parent;
    register int snode_start;	/* beginning of a snode */

    ifill (relax_end, n, SLU_EMPTY);
    ifill (relax_fsupc, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = f = 0; j < n; ) {
	parent = et[j];
	snode_start = j;
	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	relax_fsupc[f++] = snode_start;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }
}